

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Validator::get_description_abi_cxx11_(string *__return_storage_ptr__,Validator *this)

{
  if (this->active_ == true) {
    if ((this->desc_function_).super__Function_base._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->desc_function_)._M_invoker)(__return_storage_ptr__,(_Any_data *)this);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_description() const {
        if(active_) {
            return desc_function_();
        }
        return std::string{};
    }